

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O1

void xmlXPtrRangeFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectType xVar1;
  xmlElementType xVar2;
  int *piVar3;
  int *piVar4;
  xmlGenericErrorFunc p_Var5;
  xmlXPathObjectPtr pxVar6;
  xmlXPathObjectPtr obj;
  xmlLocationSetPtr cur;
  xmlGenericErrorFunc *pp_Var7;
  void **ppvVar8;
  xmlDocPtr pxVar9;
  int iVar10;
  int startindex;
  xmlDocPtr cur_00;
  long lVar11;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    if (ctxt->valueFrame < ctxt->valueNr) {
      if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
         ((xVar1 = ctxt->value->type, xVar1 != XPATH_NODESET && (xVar1 != XPATH_LOCATIONSET)))) {
        iVar10 = 0xb;
      }
      else {
        pxVar6 = valuePop(ctxt);
        obj = pxVar6;
        if (pxVar6->type == XPATH_NODESET) {
          obj = xmlXPtrNewLocationSetNodeSet(pxVar6->nodesetval);
          xmlXPathFreeObject(pxVar6);
          if (obj == (xmlXPathObjectPtr)0x0) {
            xmlXPathErr(ctxt,0xf);
            return;
          }
        }
        piVar3 = (int *)obj->user;
        cur = (xmlLocationSetPtr)(*xmlMalloc)(0x10);
        if (cur == (xmlLocationSetPtr)0x0) {
          xmlXPtrErrMemory("allocating locationset");
          cur = (xmlLocationSetPtr)0x0;
        }
        else {
          cur->locNr = 0;
          cur->locMax = 0;
          cur->locTab = (xmlXPathObjectPtr *)0x0;
        }
        if (cur != (xmlLocationSetPtr)0x0) {
          if ((piVar3 != (int *)0x0) && (0 < *piVar3)) {
            lVar11 = 0;
            do {
              piVar4 = *(int **)(*(long *)(piVar3 + 2) + lVar11 * 8);
              if (((piVar4 == (int *)0x0) || (ctxt->context == (xmlXPathContextPtr)0x0)) ||
                 (pxVar9 = ctxt->context->doc, pxVar9 == (xmlDocPtr)0x0)) {
LAB_001ee143:
                pxVar6 = (xmlXPathObjectPtr)0x0;
              }
              else {
                if (*piVar4 == 6) {
                  cur_00 = *(xmlDocPtr *)(piVar4 + 10);
                  if (*(xmlDocPtr *)(piVar4 + 0xe) == (xmlDocPtr)0x0) {
                    if (cur_00 != pxVar9) {
                      xVar2 = cur_00->type;
                      if (XML_HTML_DOCUMENT_NODE < xVar2) goto LAB_001ee143;
                      if ((0x33baU >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0) {
                        iVar10 = -1;
                        if (xVar2 != XML_NAMESPACE_DECL && cur_00 != (xmlDocPtr)0x0) {
                          iVar10 = 1;
                          pxVar9 = cur_00;
                          do {
                            if ((pxVar9->type < XML_DTD_NODE) &&
                               ((0x2202U >> (pxVar9->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) &
                                1) != 0)) {
                              iVar10 = iVar10 + 1;
                            }
                            pxVar9 = (xmlDocPtr)pxVar9->prev;
                          } while (pxVar9 != (xmlDocPtr)0x0);
                        }
                        cur_00 = (xmlDocPtr)cur_00->parent;
                        startindex = iVar10 + -1;
                        iVar10 = iVar10 + 1;
                        pxVar9 = cur_00;
                        goto LAB_001ee1e1;
                      }
                      pxVar6 = (xmlXPathObjectPtr)0x0;
                      if (xVar2 == XML_ATTRIBUTE_NODE) goto LAB_001ee1cf;
                      goto LAB_001ee145;
                    }
LAB_001ee1cf:
                    iVar10 = xmlXPtrGetArity((xmlNodePtr)cur_00);
                    startindex = 0;
                    pxVar9 = cur_00;
                  }
                  else {
                    startindex = piVar4[0xc];
                    iVar10 = piVar4[0x10];
                    pxVar9 = *(xmlDocPtr *)(piVar4 + 0xe);
                  }
                }
                else {
                  if (*piVar4 != 5) {
                    pp_Var7 = __xmlGenericError();
                    p_Var5 = *pp_Var7;
                    ppvVar8 = __xmlGenericErrorContext();
                    (*p_Var5)(*ppvVar8,"Unimplemented block at %s:%d\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpointer.c"
                              ,0x7d5);
                    goto LAB_001ee143;
                  }
                  cur_00 = *(xmlDocPtr *)(piVar4 + 10);
                  iVar10 = piVar4[0xc];
                  pxVar9 = cur_00;
                  startindex = iVar10;
                }
LAB_001ee1e1:
                pxVar6 = xmlXPtrNewRange((xmlNodePtr)cur_00,startindex,(xmlNodePtr)pxVar9,iVar10);
              }
LAB_001ee145:
              xmlXPtrLocationSetAdd(cur,pxVar6);
              lVar11 = lVar11 + 1;
            } while (lVar11 < *piVar3);
          }
          pxVar6 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
          if (pxVar6 == (xmlXPathObjectPtr)0x0) {
            xmlXPtrErrMemory("allocating locationset");
            pxVar6 = (xmlXPathObjectPtr)0x0;
          }
          else {
            *(undefined8 *)pxVar6 = 0;
            pxVar6->nodesetval = (xmlNodeSetPtr)0x0;
            pxVar6->stringval = (xmlChar *)0x0;
            pxVar6->user = (void *)0x0;
            *(undefined8 *)&pxVar6->index = 0;
            pxVar6->user2 = (void *)0x0;
            *(undefined8 *)&pxVar6->boolval = 0;
            pxVar6->floatval = 0.0;
            *(undefined8 *)&pxVar6->index2 = 0;
            pxVar6->type = XPATH_LOCATIONSET;
            pxVar6->user = cur;
          }
          valuePush(ctxt,pxVar6);
          xmlXPathFreeObject(obj);
          return;
        }
        xmlXPathFreeObject(obj);
        iVar10 = 0xf;
      }
    }
    else {
      iVar10 = 0x17;
    }
  }
  else {
    iVar10 = 0xc;
  }
  xmlXPathErr(ctxt,iVar10);
  return;
}

Assistant:

static void
xmlXPtrRangeFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    int i;
    xmlXPathObjectPtr set;
    xmlLocationSetPtr oldset;
    xmlLocationSetPtr newset;

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_LOCATIONSET) &&
	 (ctxt->value->type != XPATH_NODESET)))
        XP_ERROR(XPATH_INVALID_TYPE)

    set = valuePop(ctxt);
    if (set->type == XPATH_NODESET) {
	xmlXPathObjectPtr tmp;

	/*
	 * First convert to a location set
	 */
	tmp = xmlXPtrNewLocationSetNodeSet(set->nodesetval);
	xmlXPathFreeObject(set);
	if (tmp == NULL)
            XP_ERROR(XPATH_MEMORY_ERROR)
	set = tmp;
    }
    oldset = (xmlLocationSetPtr) set->user;

    /*
     * The loop is to compute the covering range for each item and add it
     */
    newset = xmlXPtrLocationSetCreate(NULL);
    if (newset == NULL) {
	xmlXPathFreeObject(set);
        XP_ERROR(XPATH_MEMORY_ERROR);
    }
    if (oldset != NULL) {
        for (i = 0;i < oldset->locNr;i++) {
            xmlXPtrLocationSetAdd(newset,
                    xmlXPtrCoveringRange(ctxt, oldset->locTab[i]));
        }
    }

    /*
     * Save the new value and cleanup
     */
    valuePush(ctxt, xmlXPtrWrapLocationSet(newset));
    xmlXPathFreeObject(set);
}